

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

char * llvm::printNode(Node *RootNode,char *Buf,size_t *N)

{
  size_t sVar1;
  OutputStream S;
  OutputStream local_38;
  
  local_38.CurrentPackIndex = 0xffffffff;
  local_38.CurrentPackMax = 0xffffffff;
  if (Buf == (char *)0x0) {
    sVar1 = 0x80;
    Buf = (char *)malloc(0x80);
    if (Buf == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    sVar1 = *N;
  }
  local_38.CurrentPosition = 0;
  local_38.Buffer = Buf;
  local_38.BufferCapacity = sVar1;
  (*RootNode->_vptr_Node[4])(RootNode,&local_38);
  if (RootNode->RHSComponentCache != No) {
    (*RootNode->_vptr_Node[5])(RootNode,&local_38);
  }
  OutputStream::grow(&local_38,1);
  local_38.Buffer[local_38.CurrentPosition] = '\0';
  if (N != (size_t *)0x0) {
    *N = local_38.CurrentPosition + 1;
  }
  return local_38.Buffer;
}

Assistant:

static char *printNode(Node *RootNode, char *Buf, size_t *N) {
  OutputStream S;
  if (initializeOutputStream(Buf, N, S, 128))
    return nullptr;
  RootNode->print(S);
  S += '\0';
  if (N != nullptr)
    *N = S.getCurrentPosition();
  return S.getBuffer();
}